

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::PeekMatchExpr(WastParser *this)

{
  bool bVar1;
  TokenTypePair pair;
  WastParser *this_local;
  
  pair = PeekPair(this);
  bVar1 = anon_unknown_1::IsExpr(pair);
  return bVar1;
}

Assistant:

bool WastParser::PeekMatchExpr() {
  return IsExpr(PeekPair());
}